

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O0

void __thiscall QReadWriteLockPrivate::release(QReadWriteLockPrivate *this)

{
  undefined8 in_RDI;
  int id;
  QFreeList<QReadWriteLockPrivate,_(anonymous_namespace)::QReadWriteLockFreeListConstants>
  *unaff_retaddr;
  
  id = (int)((ulong)in_RDI >> 0x20);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_qrwl_freelist>_>
  ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_qrwl_freelist>_>
                *)0x6c43e3);
  QFreeList<QReadWriteLockPrivate,_(anonymous_namespace)::QReadWriteLockFreeListConstants>::release
            (unaff_retaddr,id);
  return;
}

Assistant:

void QReadWriteLockPrivate::release()
{
    Q_ASSERT(!recursive);
    Q_ASSERT(!waitingReaders && !waitingWriters && !readerCount && !writerCount);
    qrwl_freelist->release(id);
}